

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_file.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  pointer pBVar1;
  pointer pBVar2;
  bool bVar3;
  ostream *poVar4;
  reference_type puVar5;
  uint uVar6;
  bool bVar7;
  BibTeXEntryVector e;
  optional<unsigned_long> expected;
  ifstream in;
  byte abStack_208 [488];
  
  if (argc < 2) {
    std::operator<<((ostream *)&std::cerr,"error: not enough arguments\n");
    uVar6 = 1;
  }
  else {
    expected.super_type.m_initialized = false;
    bVar7 = argc != 2;
    if (bVar7) {
      expected.super_type.m_storage = boost::lexical_cast<unsigned_long,char*>(argv + 2);
    }
    expected.super_type.m_initialized = bVar7;
    std::ifstream::ifstream(&in,argv[1],_S_in);
    if ((abStack_208[*(long *)(_in + -0x18)] & 5) == 0) {
      e.super__Vector_base<bibtex::BibTeXEntry,_std::allocator<bibtex::BibTeXEntry>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      e.super__Vector_base<bibtex::BibTeXEntry,_std::allocator<bibtex::BibTeXEntry>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      e.super__Vector_base<bibtex::BibTeXEntry,_std::allocator<bibtex::BibTeXEntry>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar3 = bibtex::
              read<char,std::char_traits<char>,std::vector<bibtex::BibTeXEntry,std::allocator<bibtex::BibTeXEntry>>>
                        ((basic_istream<char,_std::char_traits<char>_> *)&in,&e);
      poVar4 = std::operator<<((ostream *)&std::cout,"found ");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::operator<<(poVar4," entries\n");
      pBVar2 = e.super__Vector_base<bibtex::BibTeXEntry,_std::allocator<bibtex::BibTeXEntry>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      pBVar1 = e.super__Vector_base<bibtex::BibTeXEntry,_std::allocator<bibtex::BibTeXEntry>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (bVar7 && bVar3) {
        puVar5 = boost::optional<unsigned_long>::get(&expected);
        bVar3 = ((long)pBVar2 - (long)pBVar1) / 0x60 != *puVar5;
      }
      else {
        bVar3 = !bVar3;
      }
      uVar6 = (uint)bVar3;
      std::vector<bibtex::BibTeXEntry,_std::allocator<bibtex::BibTeXEntry>_>::~vector(&e);
    }
    else {
      poVar4 = std::operator<<((ostream *)&std::cerr,"error: could not open ");
      poVar4 = std::operator<<(poVar4,argv[1]);
      std::operator<<(poVar4,"\n");
      uVar6 = 1;
    }
    std::ifstream::~ifstream(&in);
  }
  return uVar6;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc < 2) {
        std::cerr << "error: not enough arguments\n";
        return EXIT_FAILURE;
    }

    using bibtex::BibTeXEntry;

    typedef std::vector<BibTeXEntry> BibTeXEntryVector;

    boost::optional<BibTeXEntryVector::size_type> expected;

    if (argc > 2) {
        try {
            expected = boost::lexical_cast<BibTeXEntryVector::size_type>
                (argv[2]);
        }
        catch (boost::bad_lexical_cast&) {
        }
    }

    std::ifstream in(argv[1]);

    if (!in) {
        std::cerr << "error: could not open " << argv[1] << "\n";
        return EXIT_FAILURE;
    }

    BibTeXEntryVector e;
    bool result = read(in, e);

    std::cout << "found " << e.size() << " entries\n";

    return result && (!expected || e.size() == *expected) ?
        EXIT_SUCCESS : EXIT_FAILURE;
}